

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RatioSequence.cpp
# Opt level: O0

RatioSequence * RatioSequence::interleave(RatioSequence *rs1,RatioSequence *rs2)

{
  size_t sVar1;
  RatioSequence *pRVar2;
  Ratio *pRVar3;
  RatioSequence *pRVar4;
  RatioSequence *in_RDI;
  bool bVar5;
  double dVar6;
  double dVar7;
  RatioSequence *in_stack_00000048;
  size_t index2;
  size_t index1;
  RatioSequence combined2;
  RatioSequence combined1;
  RatioSequence *interleavedRS;
  Ratio *in_stack_fffffffffffffed8;
  RatioSequence *in_stack_fffffffffffffee0;
  size_type in_stack_ffffffffffffff18;
  vector<Ratio,_std::allocator<Ratio>_> *in_stack_ffffffffffffff20;
  RatioSequence *local_78;
  ulong local_70;
  
  getNonDesRSWithMinDist(in_stack_00000048);
  getNonDesRSWithMinDist(in_stack_00000048);
  RatioSequence((RatioSequence *)0x18e3b3);
  size((RatioSequence *)0x18e3d6);
  size((RatioSequence *)0x18e3ed);
  std::vector<Ratio,_std::allocator<Ratio>_>::reserve
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  local_70 = 0;
  local_78 = (RatioSequence *)0x0;
  while( true ) {
    sVar1 = size((RatioSequence *)0x18e44b);
    bVar5 = false;
    if (local_70 < sVar1) {
      pRVar2 = (RatioSequence *)size((RatioSequence *)0x18e487);
      bVar5 = local_78 < pRVar2;
    }
    if (!bVar5) break;
    pRVar3 = operator[](in_stack_fffffffffffffee0,(size_t)in_stack_fffffffffffffed8);
    dVar6 = Ratio::getRatio(pRVar3);
    pRVar3 = operator[](in_stack_fffffffffffffee0,(size_t)in_stack_fffffffffffffed8);
    dVar7 = Ratio::getRatio(pRVar3);
    if (dVar7 < dVar6) {
      operator[](in_stack_fffffffffffffee0,(size_t)in_stack_fffffffffffffed8);
      push_back(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
      local_78 = (RatioSequence *)((long)&local_78->combineCode + 1);
    }
    else {
      operator[](in_stack_fffffffffffffee0,(size_t)in_stack_fffffffffffffed8);
      push_back(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
      local_70 = local_70 + 1;
    }
  }
  for (; sVar1 = size((RatioSequence *)0x18e627), local_70 < sVar1; local_70 = local_70 + 1) {
    operator[](in_stack_fffffffffffffee0,(size_t)in_stack_fffffffffffffed8);
    push_back(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  }
  while (pRVar2 = local_78, pRVar4 = (RatioSequence *)size((RatioSequence *)0x18e69f),
        pRVar2 < pRVar4) {
    in_stack_fffffffffffffed8 = operator[](pRVar2,(size_t)in_stack_fffffffffffffed8);
    push_back(pRVar2,in_stack_fffffffffffffed8);
    local_78 = (RatioSequence *)((long)&local_78->combineCode + 1);
  }
  ~RatioSequence((RatioSequence *)0x18e725);
  ~RatioSequence((RatioSequence *)0x18e732);
  return in_RDI;
}

Assistant:

RatioSequence RatioSequence::interleave(RatioSequence& rs1, RatioSequence& rs2) {
    RatioSequence combined1 = rs1.getNonDesRSWithMinDist();
    RatioSequence combined2 = rs2.getNonDesRSWithMinDist();

    RatioSequence interleavedRS = RatioSequence();
    interleavedRS._RatioSequence.reserve(combined1.size() + combined2.size());
    size_t index1 = 0;  // index for stepping through combined1
    size_t index2 = 0;  // index for stepping through combined2
    while (index1 < combined1.size() && index2 < combined2.size()) {
        if (combined1[index1].getRatio() <= combined2[index2].getRatio()) {
            interleavedRS.push_back(combined1[index1]);
            index1++;
        } else {
            interleavedRS.push_back(combined2[index2]);
            index2++;
        }
    }
    // if we have finished adding rs2 but not rs1
    while (index1 < combined1.size()) {
        interleavedRS.push_back(combined1[index1]);
        index1++;
    }
    // if we have finished adding rs1 but not rs2
    while (index2 < combined2.size()) {
        interleavedRS.push_back(combined2[index2]);
        index2++;
    }
    return interleavedRS;
}